

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

int CTcPrsOpUnary::parse_embedded_end_tok
              (CTcEmbedTokenList *tl,CTcEmbedLevel *parent,char **open_kw)

{
  int iVar1;
  int iVar2;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  CTcEmbedLevel *in_RDI;
  size_t i;
  ulong local_28;
  int local_4;
  
  *in_RDX = "unknown";
  iVar1 = CTcEmbedTokenList::match(tl,(char *)parent);
  if (((iVar1 == 0) && (iVar1 = CTcEmbedTokenList::match(tl,(char *)parent), iVar1 == 0)) &&
     (iVar1 = CTcEmbedTokenList::match(tl,(char *)parent), iVar1 == 0)) {
    iVar1 = CTcEmbedTokenList::match(tl,(char *)parent);
    if (((iVar1 != 0) || (iVar1 = CTcEmbedTokenList::match(tl,(char *)parent), iVar1 != 0)) ||
       ((iVar1 = CTcEmbedTokenList::match(tl,(char *)parent), iVar1 != 0 ||
        (iVar1 = CTcEmbedTokenList::match(tl,(char *)parent), iVar1 != 0)))) {
      *in_RDX = "<<if>> or <<unless>>";
      iVar1 = CTcEmbedLevel::is_in(in_RDI,(int)((ulong)in_RSI >> 0x20));
      if (iVar1 != 0) {
        return 1;
      }
    }
    iVar1 = CTcEmbedTokenList::match(tl,(char *)parent);
    if ((iVar1 != 0) || (iVar1 = CTcEmbedTokenList::match(tl,(char *)parent), iVar1 != 0)) {
      *in_RDX = "<<one of>>";
      iVar1 = CTcEmbedLevel::is_in(in_RDI,(int)((ulong)in_RSI >> 0x20));
      if (iVar1 != 0) {
        return 1;
      }
    }
    for (local_28 = 0; iVar1 = (int)((ulong)in_RSI >> 0x20), local_28 < 0xc; local_28 = local_28 + 1
        ) {
      iVar2 = CTcEmbedTokenList::match(tl,(char *)parent);
      iVar1 = (int)((ulong)in_RSI >> 0x20);
      if (iVar2 != 0) {
        *in_RDX = "<<one of>>";
        iVar2 = CTcEmbedLevel::is_in(in_RDI,iVar1);
        if (iVar2 != 0) {
          return 1;
        }
        break;
      }
    }
    iVar2 = CTcEmbedTokenList::match(tl,(char *)parent);
    if (iVar2 != 0) {
      *in_RDX = "<<first time>>";
      iVar1 = CTcEmbedLevel::is_in(in_RDI,iVar1);
      if (iVar1 != 0) {
        return 1;
      }
    }
    local_4 = 0;
  }
  else {
    *in_RDX = "<<if>> or <<unless>>";
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CTcPrsOpUnary::parse_embedded_end_tok(CTcEmbedTokenList *tl,
                                          CTcEmbedLevel *parent,
                                          const char **open_kw)
{
    /* presume we won't find a closing keyword */
    *open_kw = "unknown";

    /* 
     *   consider ending keywords to always be significant, regardless of
     *   context, since these are unambiguous with valid expressions 
     */
    if (tl->match("else")
        || tl->match("else if *")
        || tl->match("else unless *"))
    {
        *open_kw = "<<if>> or <<unless>>";
        return TRUE;
    }

    /* check for "if" ending tokens - else, end */
    if (tl->match("end")
        || tl->match("otherwise")
        || tl->match("otherwise if *")
        || tl->match("otherwise unless *"))
    {
        *open_kw = "<<if>> or <<unless>>";
        if (parent->is_in(CTcEmbedLevel::If))
            return TRUE;
    }

    /* check for an "or", which delimits branches of a "one of" */
    if (tl->match("or") || tl->match("||"))
    {
        *open_kw = "<<one of>>";
        if (parent->is_in(CTcEmbedLevel::OneOf))
            return TRUE;
    }

    /* check for "one of" ending tokens */
    for (size_t i = 0 ; i < countof(one_of_list) ; ++i)
    {
        if (tl->match(one_of_list[i].endph))
        {
            *open_kw = "<<one of>>";
            if (parent->is_in(CTcEmbedLevel::OneOf))
                return TRUE;
            break;
        }
    }

    /* check for an "only", which ends a "first time" */
    if (tl->match("only"))
    {
        *open_kw = "<<first time>>";
        if (parent->is_in(CTcEmbedLevel::FirstTime))
            return TRUE;
    }

    /* didn't find a close token */
    return FALSE;
}